

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O2

int testEncoding(int param_1,char **param_2)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  wchar_t *pwVar6;
  char **ppcVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *cstr_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  wchar_t *extraout_RDX_03;
  wchar_t *extraout_RDX_04;
  wchar_t *extraout_RDX_05;
  wchar_t *extraout_RDX_06;
  uint uVar8;
  pointer str_00;
  size_t i;
  ulong uVar9;
  int i_2;
  long lVar10;
  allocator local_d9;
  wstring wstr;
  string str;
  uint local_94;
  string s;
  uint local_70;
  uint local_6c;
  char cstr [2];
  undefined6 uStack_66;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  
  pcVar4 = setlocale(6,"");
  if (pcVar4 == (char *)0x0) {
    poVar5 = (ostream *)&std::cout;
    pcVar4 = "Locale: None";
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Locale: ");
  }
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar5);
  lVar10 = 0;
  local_70 = 0;
  pcVar4 = extraout_RDX;
  do {
    if (lVar10 == 0x100) {
      cstr[0] = -1;
      cstr[1] = '\0';
      cmsys::Encoding::ToWide_abi_cxx11_((wstring *)&str,(Encoding *)cstr,pcVar4);
      cmsys::Encoding::ToWide_abi_cxx11_(&wstr,(Encoding *)0x0,cstr_00);
      std::__cxx11::wstring::operator=((wstring *)&str,(wstring *)&wstr);
      std::__cxx11::wstring::~wstring((wstring *)&wstr);
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&str,L"");
      _Var1 = str._M_dataplus;
      local_94 = 0;
      pcVar4 = extraout_RDX_01;
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"ToWide(NULL) returned");
        for (uVar9 = 0; uVar9 < str._M_string_length; uVar9 = uVar9 + 1) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar5,*(int *)(_Var1._M_p + uVar9 * 4));
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_94 = 1;
        pcVar4 = extraout_RDX_02;
      }
      cmsys::Encoding::ToWide_abi_cxx11_(&wstr,(Encoding *)"",pcVar4);
      std::__cxx11::wstring::operator=((wstring *)&str,(wstring *)&wstr);
      std::__cxx11::wstring::~wstring((wstring *)&wstr);
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&str,L"");
      pwVar6 = extraout_RDX_03;
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"ToWide(\"\") returned");
        for (uVar9 = 0; uVar9 < str._M_string_length; uVar9 = uVar9 + 1) {
          poVar5 = std::operator<<((ostream *)&std::cout," ");
          *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
               *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
          std::ostream::operator<<(poVar5,*(int *)(str._M_dataplus._M_p + uVar9 * 4));
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        local_94 = local_94 + 1;
        pwVar6 = extraout_RDX_04;
      }
      cmsys::Encoding::ToNarrow_abi_cxx11_((string *)&wstr,(Encoding *)0x0,pwVar6);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &wstr,"");
      pwVar6 = extraout_RDX_05;
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ToNarrow(NULL) returned ");
        poVar5 = std::operator<<(poVar5,(string *)&wstr);
        std::endl<char,std::char_traits<char>>(poVar5);
        local_94 = local_94 + 1;
        pwVar6 = extraout_RDX_06;
      }
      cmsys::Encoding::ToNarrow_abi_cxx11_(&s,(Encoding *)L"",pwVar6);
      std::__cxx11::string::operator=((string *)&wstr,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      bVar2 = std::operator!=((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)&str,L"");
      if (bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"ToNarrow(\"\") returned ");
        poVar5 = std::operator<<(poVar5,(string *)&wstr);
        std::endl<char,std::char_traits<char>>(poVar5);
        local_94 = local_94 + 1;
      }
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::wstring::~wstring((wstring *)&str);
      _cstr = "./app.exe";
      cmsys::Encoding::CommandLineArguments::CommandLineArguments
                ((CommandLineArguments *)&str,2,(char **)cstr);
      cmsys::Encoding::CommandLineArguments::CommandLineArguments
                ((CommandLineArguments *)&wstr,(CommandLineArguments *)&str);
      ppcVar7 = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)&str);
      lVar10 = 0;
      local_6c = 0;
      while( true ) {
        iVar3 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)&str);
        if (iVar3 <= lVar10) break;
        pcVar4 = ppcVar7[lVar10];
        iVar3 = strcmp(*(char **)(cstr + lVar10 * 8),pcVar4);
        if (iVar3 != 0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"argv[");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar10);
          poVar5 = std::operator<<(poVar5,"] ");
          poVar5 = std::operator<<(poVar5,*(char **)(cstr + lVar10 * 8));
          poVar5 = std::operator<<(poVar5," != ");
          poVar5 = std::operator<<(poVar5,pcVar4);
          std::endl<char,std::char_traits<char>>(poVar5);
          local_6c = local_6c + 1;
        }
        lVar10 = lVar10 + 1;
      }
      cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)&s,2,(char **)cstr);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&s);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&wstr);
      cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&str);
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&s,"ab",(allocator *)cstr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr,&s,
                     '\0');
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,'c');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::string((string *)cstr,"d",&local_d9);
      std::operator+(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cstr,
                     '\0');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr,&s,
                     '\0');
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,'e');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)cstr);
      s._M_string_length = 0;
      s.field_2._M_allocated_capacity._0_4_ = s.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      s._M_dataplus._M_p = (pointer)&s.field_2;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr,&s,
                     '\0');
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,'f');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::~string((string *)&s);
      local_58._M_allocated_capacity._0_4_ = local_58._M_allocated_capacity._0_4_ & 0xffffff00;
      _cstr = (char *)&local_58;
      std::operator+(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cstr,
                     '\0');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr,&s,
                     '\0');
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,"gh");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::~string((string *)&s);
      std::__cxx11::string::~string((string *)cstr);
      std::__cxx11::string::string((string *)&wstr,"ij",(allocator *)&s);
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,'\0');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::string((string *)&s,"k",(allocator *)cstr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr,&s,
                     '\0');
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,'\0');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::~string((string *)&s);
      s.field_2._M_allocated_capacity._0_4_ = 0;
      s._M_string_length = 4;
      s.field_2._M_local_buf[4] = '\0';
      s._M_dataplus._M_p = (pointer)&s.field_2;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr,&s,
                     "lmn");
      local_58._M_allocated_capacity._0_4_ = 0;
      local_58._M_local_buf[4] = '\0';
      _cstr = (char *)&local_58;
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wstr
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cstr);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&strings,&str)
      ;
      std::__cxx11::string::~string((string *)&str);
      std::__cxx11::string::~string((string *)cstr);
      std::__cxx11::string::~string((string *)&wstr);
      std::__cxx11::string::~string((string *)&s);
      uVar8 = 0;
      for (str_00 = strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          str_00 != strings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; str_00 = str_00 + 1) {
        cmsys::Encoding::ToWide((wstring *)&str,str_00);
        cmsys::Encoding::ToNarrow((string *)&wstr,(wstring *)&str);
        std::__cxx11::string::string((string *)&s,(string *)str_00);
        _cstr = (char *)((ulong)_cstr & 0xffffffffffffff00);
        local_d9 = (allocator)0x20;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )s._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(s._M_dataplus._M_p + s._M_string_length),cstr,(char *)&local_d9);
        poVar5 = std::operator<<((ostream *)&std::cout,"\'");
        poVar5 = std::operator<<(poVar5,(string *)&s);
        poVar5 = std::operator<<(poVar5,"\' (");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,")");
        std::endl<char,std::char_traits<char>>(poVar5);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&wstr,str_00);
        if (bVar2) {
          _cstr = (char *)((ulong)_cstr & 0xffffffffffffff00);
          local_d9 = (allocator)0x20;
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )wstr._M_dataplus._M_p,
                     (char *)(wstr._M_string_length + (long)wstr._M_dataplus._M_p),cstr,
                     (char *)&local_d9);
          poVar5 = std::operator<<((ostream *)&std::cout,"string with null was different: \'");
          poVar5 = std::operator<<(poVar5,(string *)&wstr);
          poVar5 = std::operator<<(poVar5,"\' (");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5,")");
          std::endl<char,std::char_traits<char>>(poVar5);
          uVar8 = uVar8 + 1;
        }
        std::__cxx11::string::~string((string *)&s);
        std::__cxx11::string::~string((string *)&wstr);
        std::__cxx11::wstring::~wstring((wstring *)&str);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&strings);
      return local_6c | uVar8 | local_94 | local_70;
    }
    std::__cxx11::string::string
              ((string *)&str,(char *)(helloWorldStrings[0] + lVar10),(allocator *)&wstr);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&str);
    std::endl<char,std::char_traits<char>>(poVar5);
    cmsys::Encoding::ToWide(&wstr,&str);
    cmsys::Encoding::ToNarrow(&s,&wstr);
    pwVar6 = cmsysEncoding_DupToWide(str._M_dataplus._M_p);
    pcVar4 = cmsysEncoding_DupToNarrow(pwVar6);
    if (wstr._M_string_length != 0) {
      bVar2 = std::operator!=(&str,&s);
      if (!bVar2) {
        iVar3 = strcmp(pcVar4,str._M_dataplus._M_p);
        if (iVar3 == 0) goto LAB_001231d4;
      }
      poVar5 = std::operator<<((ostream *)&std::cout,"converted string was different: ");
      poVar5 = std::operator<<(poVar5,(string *)&s);
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"converted string was different: ");
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar5);
      local_70 = local_70 + 1;
    }
LAB_001231d4:
    free(pwVar6);
    free(pcVar4);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::wstring::~wstring((wstring *)&wstr);
    std::__cxx11::string::~string((string *)&str);
    lVar10 = lVar10 + 0x20;
    pcVar4 = extraout_RDX_00;
  } while( true );
}

Assistant:

int testEncoding(int, char* [])
{
  const char* loc = setlocale(LC_ALL, "");
  if (loc) {
    std::cout << "Locale: " << loc << std::endl;
  } else {
    std::cout << "Locale: None" << std::endl;
  }

  int ret = 0;

  ret |= testHelloWorldEncoding();
  ret |= testRobustEncoding();
  ret |= testCommandLineArguments();
  ret |= testWithNulls();
  ret |= testToWindowsExtendedPath();

  return ret;
}